

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalProgramTrigger.cpp
# Opt level: O1

void * ExternalProgramTriggerThread(void *pParam)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  FILE *__stream;
  FILE *__stream_00;
  ulong uVar5;
  long *plVar6;
  int iVar7;
  CHRONO chrono;
  char logexternalprogramtriggerfilename [256];
  timespec local_198;
  FILE *local_188;
  timespec local_180;
  ulong local_170;
  long lStack_168;
  ulong local_160;
  long lStack_158;
  timespec local_150;
  int local_140;
  char local_138 [264];
  
  pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
  pcVar4 = strtimeex_fns();
  iVar7 = (int)pParam;
  sprintf(local_138,"log/logexternalprogramtrigger%d_%.64s.csv",(ulong)pParam & 0xffffffff,pcVar4);
  pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
  __stream = fopen(local_138,"w");
  if (__stream == (FILE *)0x0) {
    puts("Unable to create log file.");
  }
  else {
    fprintf(__stream,"%% Time (in s); Trigger (1 : on, 0 : off);\n");
    fflush(__stream);
    iVar2 = clock_getres(4,&local_150);
    if (iVar2 == 0) {
      iVar2 = clock_gettime(4,&local_180);
      if (iVar2 == 0) {
        local_140 = 0;
        local_170 = 0;
        lStack_168 = 0;
        local_160 = 0;
        lStack_158 = 0;
      }
    }
    local_188 = __stream;
    do {
      do {
        uVar1 = period_externalprogramtrigger[iVar7] * 1000;
        if (period_externalprogramtrigger[iVar7] < 1) {
          uVar1 = 100000;
        }
        local_198.tv_sec = (ulong)uVar1 / 1000000;
        local_198.tv_nsec = ((ulong)uVar1 % 1000000) * 1000;
        nanosleep(&local_198,(timespec *)0x0);
        if (bExit != 0) goto LAB_0019997e;
      } while (bExternalProgramTrigger[iVar7] == 0);
      pthread_mutex_lock((pthread_mutex_t *)(ExternalProgramTriggerCS + iVar7));
      __stream_00 = fopen(ExternalProgramTriggerFileName[iVar7],"r");
      if (__stream_00 != (FILE *)0x0) {
        fclose(__stream_00);
        bExternalProgramTriggerDetected[iVar7] = 1;
        if (local_140 == 0) {
          clock_gettime(4,&local_198);
          local_198.tv_sec =
               (local_198.tv_sec + local_160 + (local_198.tv_nsec + lStack_158) / 1000000000) -
               local_180.tv_sec;
          local_198.tv_nsec = (local_198.tv_nsec + lStack_158) % 1000000000 - local_180.tv_nsec;
          if (local_198.tv_nsec < 0) {
            local_198.tv_sec = (local_198.tv_sec + local_198.tv_nsec / 1000000000) - 1;
            local_198.tv_nsec = local_198.tv_nsec % 1000000000 + 1000000000;
          }
          plVar6 = &local_198.tv_nsec;
          uVar5 = local_198.tv_sec;
        }
        else {
          plVar6 = &lStack_158;
          uVar5 = local_160;
        }
        fprintf(__stream,"%f;%d;\n",SUB84((double)*plVar6 / 1000000000.0 + (double)(long)uVar5,0),
                (ulong)(uint)bExternalProgramTriggerDetected[iVar7]);
        fflush(__stream);
        if (procid_externalprogramtrigger[iVar7] != -1) {
          bExternalProgramTrigger[iVar7] = 0;
          if (0 < nbretries_externalprogramtrigger[iVar7]) {
            iVar2 = 0;
            do {
              iVar3 = remove(ExternalProgramTriggerFileName[iVar7]);
              if (iVar3 == 0) break;
              local_198.tv_sec = ((long)retrydelay_externalprogramtrigger[iVar7] * 1000) / 1000000;
              local_198.tv_nsec =
                   (((long)retrydelay_externalprogramtrigger[iVar7] * 1000) % 1000000) * 1000;
              nanosleep(&local_198,(timespec *)0x0);
              iVar2 = iVar2 + 1;
            } while (iVar2 < nbretries_externalprogramtrigger[iVar7]);
          }
          if (bEcho != 0) {
            printf("execute %d\n");
          }
          ExecuteProcedure(procid_externalprogramtrigger[iVar7]);
          bWaiting = 0;
          __stream = local_188;
        }
      }
      pthread_mutex_unlock((pthread_mutex_t *)(ExternalProgramTriggerCS + iVar7));
    } while (bExit == 0);
LAB_0019997e:
    if (local_140 == 0) {
      clock_gettime(4,&local_198);
      local_170 = local_198.tv_sec;
      lStack_168 = local_198.tv_nsec;
      local_198.tv_sec =
           (local_198.tv_sec + local_160 + (local_198.tv_nsec + lStack_158) / 1000000000) -
           local_180.tv_sec;
      local_198.tv_nsec = (local_198.tv_nsec + lStack_158) % 1000000000 - local_180.tv_nsec;
      if (local_198.tv_nsec < 0) {
        local_198.tv_sec = (local_198.tv_sec + local_198.tv_nsec / 1000000000) - 1;
        local_198.tv_nsec = local_198.tv_nsec % 1000000000 + 1000000000;
      }
      local_160 = local_198.tv_sec;
      lStack_158 = local_198.tv_nsec;
    }
    fclose(__stream);
  }
  if (bExit == 0) {
    bExit = 1;
  }
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE ExternalProgramTriggerThread(void* pParam)
{
	int id = (int)(intptr_t)pParam;

	FILE* logexternalprogramtriggerfile = NULL;
	char logexternalprogramtriggerfilename[MAX_BUF_LEN];

	FILE* file = NULL;
	int i = 0;
	CHRONO chrono;

	EnterCriticalSection(&strtimeCS);
	sprintf(logexternalprogramtriggerfilename, LOG_FOLDER"logexternalprogramtrigger%d_%.64s.csv", id, strtimeex_fns());
	LeaveCriticalSection(&strtimeCS);
	logexternalprogramtriggerfile = fopen(logexternalprogramtriggerfilename, "w");
	if (logexternalprogramtriggerfile == NULL)
	{
		printf("Unable to create log file.\n");
		if (!bExit) bExit = TRUE; // Unexpected program exit...
		return 0;
	}

	fprintf(logexternalprogramtriggerfile, "%% Time (in s); Trigger (1 : on, 0 : off);\n");
	fflush(logexternalprogramtriggerfile);

	StartChrono(&chrono);

	for (;;)
	{
		uSleep(1000*(period_externalprogramtrigger[id] > 0? period_externalprogramtrigger[id]: 100));

		if (bExit) break;
		if (!bExternalProgramTrigger[id]) continue;

		EnterCriticalSection(&ExternalProgramTriggerCS[id]);

		file = fopen(ExternalProgramTriggerFileName[id], "r");
		if (file != NULL)
		{
			fclose(file);
			bExternalProgramTriggerDetected[id] = TRUE;
#pragma region Actions
			fprintf(logexternalprogramtriggerfile, "%f;%d;\n", GetTimeElapsedChronoQuick(&chrono), bExternalProgramTriggerDetected[id]);
			fflush(logexternalprogramtriggerfile);

			if (procid_externalprogramtrigger[id] != -1)
			{
				// disableexternalprogramtrigger to avoid multiple execute...
				bExternalProgramTrigger[id] = FALSE;
				for (i = 0; i < nbretries_externalprogramtrigger[id]; i++)
				{
					if (remove(ExternalProgramTriggerFileName[id]) == 0) break;
					uSleep(1000*retrydelay_externalprogramtrigger[id]);
				}
				if (bEcho) printf("execute %d\n", procid_externalprogramtrigger[id]);
				ExecuteProcedure(procid_externalprogramtrigger[id]);
				bWaiting = FALSE; // To interrupt and force execution of the next commands...
			}
#pragma endregion
		}

		LeaveCriticalSection(&ExternalProgramTriggerCS[id]);

		if (bExit) break;
	}

	StopChronoQuick(&chrono);

	fclose(logexternalprogramtriggerfile);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}